

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int live_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  bitmap_t bm;
  ulong uVar1;
  uint uVar2;
  int iVar3;
  out_edge_t peVar4;
  ulong uVar5;
  uint uVar6;
  out_edge_t peVar7;
  bb_insn_t pbVar8;
  long lVar9;
  bool bVar10;
  
  peVar7 = (bb->out_edges).head;
  uVar6 = 0;
LAB_0016cd7a:
  if (peVar7 == (out_edge_t)0x0) {
    return uVar6;
  }
  uVar2 = bitmap_ior(bb->out,bb->out,peVar7->dst->in);
  uVar6 = uVar2 | uVar6;
  if (gen_ctx->lr_ctx->ssa_live_info_p != 0) {
    for (pbVar8 = (peVar7->dst->bb_insns).head; pbVar8 != (bb_insn_t)0x0;
        pbVar8 = (pbVar8->bb_insn_link).next) {
      iVar3 = *(int *)&pbVar8->insn->field_0x18;
      if (iVar3 != 0xb4) {
        if (iVar3 == 0xba) {
          peVar4 = (peVar7->dst->in_edges).head;
          bVar10 = peVar4 == peVar7;
          lVar9 = 1;
          if (peVar4 != (out_edge_t)0x0 && !bVar10) goto LAB_0016ce05;
          goto LAB_0016ce1c;
        }
        break;
      }
    }
  }
  goto LAB_0016ce9f;
  while (peVar4 != peVar7) {
LAB_0016ce05:
    peVar4 = (peVar4->in_link).next;
    bVar10 = peVar4 == peVar7;
    lVar9 = lVar9 + 1;
    if (peVar4 == (in_edge_t)0x0) break;
  }
LAB_0016ce1c:
  if (!bVar10) {
LAB_0016cebf:
    __assert_fail("e2 == e",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1732,"int live_con_func_n(gen_ctx_t, bb_t)");
  }
  do {
    if (pbVar8->insn->ops[lVar9].field_0x8 == '\x02') {
      bm = bb->out;
      iVar3 = var_to_scan_var(gen_ctx,pbVar8->insn->ops[lVar9].u.reg);
      uVar5 = (ulong)iVar3;
      bitmap_expand(bm,uVar5 + 1);
      if (bm == (bitmap_t)0x0) {
        live_con_func_n_cold_1();
        goto LAB_0016cebf;
      }
      uVar1 = bm->varr[uVar5 >> 6];
      bm->varr[uVar5 >> 6] = uVar1 | 1L << (uVar5 & 0x3f);
      uVar6 = uVar6 | (uVar1 >> (uVar5 & 0x3f) & 1) == 0;
    }
    pbVar8 = (pbVar8->bb_insn_link).next;
  } while ((pbVar8 != (bb_insn_t)0x0) && (*(int *)&pbVar8->insn->field_0x18 == 0xba));
LAB_0016ce9f:
  peVar7 = (peVar7->out_link).next;
  goto LAB_0016cd7a;
}

Assistant:

static int live_con_func_n (gen_ctx_t gen_ctx, bb_t bb) {
  MIR_op_t *op_ref;
  bb_insn_t bb_insn;
  edge_t e, e2;
  int n, change_p = FALSE;

  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e)) {
    change_p |= bitmap_ior (bb->live_out, bb->live_out, e->dst->live_in);
    if (ssa_live_info_p) {
      for (bb_insn = DLIST_HEAD (bb_insn_t, e->dst->bb_insns); bb_insn != NULL;
           bb_insn = DLIST_NEXT (bb_insn_t, bb_insn))
        if (bb_insn->insn->code != MIR_LABEL) break;
      if (bb_insn == NULL || bb_insn->insn->code != MIR_PHI) continue; /* no phis in dst */
      for (n = 1, e2 = DLIST_HEAD (in_edge_t, e->dst->in_edges); e2 != NULL;
           e2 = DLIST_NEXT (in_edge_t, e2), n++)
        if (e2 == e) break;
      gen_assert (e2 == e);
      for (;;) {
        op_ref = &bb_insn->insn->ops[n];
        if (op_ref->mode == MIR_OP_VAR)
          change_p |= bitmap_set_bit_p (bb->live_out, var_to_scan_var (gen_ctx, op_ref->u.var));
        if ((bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) == NULL || bb_insn->insn->code != MIR_PHI)
          break;
      }
    }
  }
  return change_p;
}